

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

BeginImplFrameArgs_TimestampsInUs * __thiscall
perfetto::protos::gen::BeginImplFrameArgs_TimestampsInUs::operator=
          (BeginImplFrameArgs_TimestampsInUs *this,BeginImplFrameArgs_TimestampsInUs *param_1)

{
  BeginImplFrameArgs_TimestampsInUs *param_1_local;
  BeginImplFrameArgs_TimestampsInUs *this_local;
  
  protozero::CppMessageObj::operator=(&this->super_CppMessageObj,&param_1->super_CppMessageObj);
  memcpy(&this->interval_delta_,&param_1->interval_delta_,0x38);
  ::std::__cxx11::string::operator=
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

bool BeginImplFrameArgs_TimestampsInUs::operator==(const BeginImplFrameArgs_TimestampsInUs& other) const {
  return unknown_fields_ == other.unknown_fields_
   && interval_delta_ == other.interval_delta_
   && now_to_deadline_delta_ == other.now_to_deadline_delta_
   && frame_time_to_now_delta_ == other.frame_time_to_now_delta_
   && frame_time_to_deadline_delta_ == other.frame_time_to_deadline_delta_
   && now_ == other.now_
   && frame_time_ == other.frame_time_
   && deadline_ == other.deadline_;
}